

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::TestParsingMergeLite::ByteSizeLong(TestParsingMergeLite *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite> *this_00;
  reference value;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedGroup> *this_01;
  reference value_00;
  uint32_t *puVar4;
  size_t sVar5;
  long lVar6;
  TestParsingMergeLite_RepeatedGroup *msg_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedGroup> *__range2_1;
  TestAllTypesLite *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite> *__range2;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestParsingMergeLite *this_;
  TestParsingMergeLite *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = google::protobuf::internal::ExtensionSet::ByteSize
                        (&(this->field_0)._impl_._extensions_);
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar3 = _internal_repeated_all_types_size(this);
  sStack_58 = (long)iVar3 + sStack_58;
  this_00 = _internal_repeated_all_types(this);
  __end2 = google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::begin(this_00);
  msg = (TestAllTypesLite *)
        google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::end(this_00);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2,(iterator *)&msg), bVar2) {
    value = google::protobuf::internal::RepeatedPtrIterator<const_proto2_unittest::TestAllTypesLite>
            ::operator*(&__end2);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto2_unittest::TestAllTypesLite>(value);
    sStack_58 = sVar5 + sStack_58;
    google::protobuf::internal::RepeatedPtrIterator<const_proto2_unittest::TestAllTypesLite>::
    operator++(&__end2);
  }
  iVar3 = _internal_repeatedgroup_size(this);
  sStack_58 = (long)iVar3 * 4 + sStack_58;
  this_01 = _internal_repeatedgroup(this);
  __end2_1 = google::protobuf::RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedGroup>
             ::begin(this_01);
  msg_1 = (TestParsingMergeLite_RepeatedGroup *)
          google::protobuf::RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedGroup>::
          end(this_01);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2_1,(iterator *)&msg_1), bVar2) {
    value_00 = google::protobuf::internal::
               RepeatedPtrIterator<const_proto2_unittest::TestParsingMergeLite_RepeatedGroup>::
               operator*(&__end2_1);
    sVar5 = google::protobuf::internal::WireFormatLite::
            GroupSize<proto2_unittest::TestParsingMergeLite_RepeatedGroup>(value_00);
    sStack_58 = sVar5 + sStack_58;
    google::protobuf::internal::
    RepeatedPtrIterator<const_proto2_unittest::TestParsingMergeLite_RepeatedGroup>::operator++
              (&__end2_1);
  }
  puVar4 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar4;
  if ((uVar1 & 1) != 0) {
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto2_unittest::TestAllTypesLite>
                      ((this->field_0)._impl_.required_all_types_);
    sStack_58 = sVar5 + 1 + sStack_58;
  }
  if ((uVar1 & 6) != 0) {
    if ((uVar1 & 2) != 0) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::TestAllTypesLite>
                        ((this->field_0)._impl_.optional_all_types_);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              GroupSize<proto2_unittest::TestParsingMergeLite_OptionalGroup>
                        ((this->field_0)._impl_.optionalgroup_);
      sStack_58 = sVar5 + 2 + sStack_58;
    }
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar2) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar6 = std::__cxx11::string::size();
    sStack_58 = lVar6 + sStack_58;
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_58);
  google::protobuf::internal::CachedSize::Set(&(this->field_0)._impl_._cached_size_,iVar3);
  return sStack_58;
}

Assistant:

::size_t TestParsingMergeLite::ByteSizeLong() const {
  const TestParsingMergeLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestParsingMergeLite)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto2_unittest.TestAllTypesLite repeated_all_types = 3;
    {
      total_size += 1UL * this_._internal_repeated_all_types_size();
      for (const auto& msg : this_._internal_repeated_all_types()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest.TestParsingMergeLite.RepeatedGroup repeatedgroup = 20 [features = {
    {
      total_size += 4UL * this_._internal_repeatedgroup_size();
      for (const auto& msg : this_._internal_repeatedgroup()) {
        total_size += ::google::protobuf::internal::WireFormatLite::GroupSize(msg);
      }
    }
  }
   {
    // .proto2_unittest.TestAllTypesLite required_all_types = 1 [features = {
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.required_all_types_);
    }
  }
  if ((cached_has_bits & 0x00000006u) != 0) {
    // .proto2_unittest.TestAllTypesLite optional_all_types = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_all_types_);
    }
    // .proto2_unittest.TestParsingMergeLite.OptionalGroup optionalgroup = 10 [features = {
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::GroupSize(*this_._impl_.optionalgroup_);
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}